

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 gen_load_gpr(DisasContext_conflict8 *dc,int reg)

{
  int iVar1;
  TCGContext_conflict8 *s;
  TCGTemp *a1;
  TCGv_i64 pTVar2;
  
  s = dc->uc->tcg_ctx;
  if (reg < 1) {
    if (4 < (uint)dc->n_ttl) {
      __assert_fail("dc->n_ttl < ARRAY_SIZE(dc->ttl)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x7c,"TCGv_i64 get_temp_tl(DisasContext *)");
    }
    a1 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I64,false);
    pTVar2 = (TCGv_i64)((long)a1 - (long)s);
    iVar1 = dc->n_ttl;
    dc->n_ttl = iVar1 + 1;
    dc->ttl[iVar1] = (TCGv_i32)pTVar2;
    tcg_gen_op2_sparc64(s,INDEX_op_movi_i64,(TCGArg)a1,0);
  }
  else {
    if (0x1f < (uint)reg) {
      __assert_fail("reg < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x12a,"TCGv_i64 gen_load_gpr(DisasContext *, int)");
    }
    pTVar2 = s->cpu_regs[(uint)reg];
  }
  return (TCGv_i32)pTVar2;
}

Assistant:

static inline TCGv gen_load_gpr(DisasContext *dc, int reg)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (reg > 0) {
        assert(reg < 32);
        return tcg_ctx->cpu_regs[reg];
    } else {
        TCGv t = get_temp_tl(dc);
        tcg_gen_movi_tl(tcg_ctx, t, 0);
        return t;
    }
}